

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::PragmaExpressionSyntax::isKind(SyntaxKind kind)

{
  if (((0x2a < kind - NameValuePragmaExpression) ||
      ((0x40000200001U >> ((ulong)(kind - NameValuePragmaExpression) & 0x3f) & 1) == 0)) &&
     (kind != SimplePragmaExpression)) {
    return false;
  }
  return true;
}

Assistant:

bool PragmaExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NameValuePragmaExpression:
        case SyntaxKind::NumberPragmaExpression:
        case SyntaxKind::ParenPragmaExpression:
        case SyntaxKind::SimplePragmaExpression:
            return true;
        default:
            return false;
    }
}